

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

int loader_impl_destroy_type_map_cb_iterate
              (set s,set_key key,set_value val,set_cb_iterate_args args)

{
  if (val != (set_value)0x0) {
    type_destroy((type_conflict)val);
    return 0;
  }
  return 1;
}

Assistant:

int loader_impl_destroy_type_map_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;
	(void)key;
	(void)args;

	if (val != NULL)
	{
		type t = val;

		type_destroy(t);

		return 0;
	}

	return 1;
}